

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O1

NodeSequence __thiscall
GraphBuilder::insertFunctionPointerCall(GraphBuilder *this,CallInst *callInstruction)

{
  CallFuncPtrNode *this_00;
  CallReturnNode *this_01;
  Node *node;
  pointer ppFVar1;
  NodeSequence NVar2;
  NodeSequence NVar3;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> functions;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> local_48;
  
  dg::getCalledFunctions
            (&local_48,*(Value **)(callInstruction + -0x20),
             (LLVMPointerAnalysis *)this->pointsToAnalysis_);
  this_00 = (CallFuncPtrNode *)operator_new(0x80);
  CallFuncPtrNode::CallFuncPtrNode(this_00,(Instruction *)callInstruction);
  NVar3.first = &addNode<CallFuncPtrNode>(this,this_00)->super_Node;
  if ((ulong)((long)local_48.
                    super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_48.
                   super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 9) {
    if ((long)local_48.
              super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_48.
              super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
              _M_impl.super__Vector_impl_data._M_start == 8) {
      NVar2 = insertFunction(this,*local_48.
                                   super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start,callInstruction);
    }
    else {
      NVar2 = buildGeneralCallInstruction(this,callInstruction);
    }
    node = NVar2.second;
    Node::addSuccessor(NVar3.first,NVar2.first);
  }
  else {
    this_01 = (CallReturnNode *)operator_new(0x80);
    CallReturnNode::CallReturnNode(this_01);
    node = &addNode<CallReturnNode>(this,this_01)->super_Node;
    for (ppFVar1 = local_48.
                   super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppFVar1 !=
        local_48.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppFVar1 = ppFVar1 + 1) {
      NVar2 = insertFunction(this,*ppFVar1,callInstruction);
      Node::addSuccessor(NVar3.first,NVar2.first);
      Node::addSuccessor(NVar2.second,node);
    }
  }
  if (local_48.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  NVar3.second = node;
  return NVar3;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::insertFunctionPointerCall(const CallInst *callInstruction) {
#if LLVM_VERSION_MAJOR >= 8
    auto *calledValue = callInstruction->getCalledOperand();
#else
    auto *calledValue = callInstruction->getCalledValue();
#endif
    auto functions = getCalledFunctions(calledValue, pointsToAnalysis_);

    auto *callFuncPtrNode =
            addNode(createNode<NodeType::CALL_FUNCPTR>(callInstruction));
    Node *returnNode;

    if (functions.size() > 1) {
        returnNode = addNode(createNode<NodeType::CALL_RETURN>());
        for (const auto *function : functions) {
            auto nodeSeq = insertFunction(function, callInstruction);
            callFuncPtrNode->addSuccessor(nodeSeq.first);
            nodeSeq.second->addSuccessor(returnNode);
        }
    } else if (functions.size() == 1) {
        auto nodeSeq = insertFunction(functions.front(), callInstruction);
        callFuncPtrNode->addSuccessor(nodeSeq.first);
        returnNode = nodeSeq.second;
    } else {
        auto nodeSeq = buildGeneralCallInstruction(callInstruction);
        callFuncPtrNode->addSuccessor(nodeSeq.first);
        returnNode = nodeSeq.second;
    }
    return {callFuncPtrNode, returnNode};
}